

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

void __thiscall icu_63::MessagePattern::~MessagePattern(MessagePattern *this)

{
  MaybeStackArray<icu_63::MessagePattern::Part,_32> *this_00;
  MaybeStackArray<double,_8> *this_01;
  void *in_RSI;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_003b4e20;
  this_00 = (MaybeStackArray<icu_63::MessagePattern::Part,_32> *)this->partsList;
  if (this_00 != (MaybeStackArray<icu_63::MessagePattern::Part,_32> *)0x0) {
    MaybeStackArray<icu_63::MessagePattern::Part,_32>::~MaybeStackArray(this_00);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  this_01 = (MaybeStackArray<double,_8> *)this->numericValuesList;
  if (this_01 != (MaybeStackArray<double,_8> *)0x0) {
    MaybeStackArray<double,_8>::~MaybeStackArray(this_01);
  }
  UMemory::operator_delete((UMemory *)this_01,in_RSI);
  UnicodeString::~UnicodeString(&this->msg);
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

MessagePattern::~MessagePattern() {
    delete partsList;
    delete numericValuesList;
}